

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_json.cpp
# Opt level: O0

ErrorStackOption *
ritobin::io::json_impl::json_value_impl<ritobin::Vec2,_(ritobin::Category)2>::from_json
          (ErrorStackOption *__return_storage_ptr__,Vec2 *value,json *json)

{
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *this;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  reference this_00;
  reference pvVar4;
  float fVar5;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *item;
  const_iterator __end3;
  const_iterator __begin3;
  json *__range3;
  size_t i;
  char *local_78;
  string asStack_70 [32];
  undefined1 local_50 [48];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *local_20;
  json *json_local;
  Vec2 *value_local;
  
  local_20 = json;
  json_local = (json *)value;
  value_local = (Vec2 *)__return_storage_ptr__;
  bVar1 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::is_array(json);
  if (bVar1) {
    sVar2 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::size(local_20);
    sVar3 = std::array<float,_2UL>::size((array<float,_2UL> *)json_local);
    this = local_20;
    if (sVar3 < sVar2) {
      i = (size_t)Vec2::type_name;
      local_78 = "json.size() <= value.value.size()";
      std::__cxx11::string::string(asStack_70);
      std::optional<ritobin::io::json_impl::ErrorStack>::
      optional<ritobin::io::json_impl::ErrorStack,_true>(__return_storage_ptr__,(ErrorStack *)&i);
      ErrorStack::~ErrorStack((ErrorStack *)&i);
    }
    else {
      __range3 = (json *)0x0;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::begin((const_iterator *)&__end3.m_it.primitive_iterator,local_20);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::end((const_iterator *)&item,this);
      while( true ) {
        bVar1 = nlohmann::detail::
                iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator!=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)&__end3.m_it.primitive_iterator,
                             (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)&item);
        if (!bVar1) break;
        this_00 = nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)&__end3.m_it.primitive_iterator);
        fVar5 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator_float<float,_0>(this_00);
        pvVar4 = std::array<float,_2UL>::operator[]
                           ((array<float,_2UL> *)json_local,(size_type)__range3);
        *pvVar4 = fVar5;
        nlohmann::detail::
        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator++((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)&__end3.m_it.primitive_iterator);
        __range3 = (json *)&__range3->field_0x1;
      }
      std::optional<ritobin::io::json_impl::ErrorStack>::optional(__return_storage_ptr__);
    }
  }
  else {
    local_50._0_8_ = "vec2";
    local_50._8_8_ = "json.is_array()";
    std::__cxx11::string::string((string *)(local_50 + 0x10));
    std::optional<ritobin::io::json_impl::ErrorStack>::
    optional<ritobin::io::json_impl::ErrorStack,_true>
              (__return_storage_ptr__,(ErrorStack *)local_50);
    ErrorStack::~ErrorStack((ErrorStack *)local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

static ErrorStackOption from_json(T& value, json const& json) noexcept {
            bin_json_assert(json.is_array());
            bin_json_assert(json.size() <= value.value.size());
            size_t i = 0;
            for (auto const& item: json) {
                value.value[i++] = item;
            }
            return std::nullopt;
        }